

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O0

void anon_unknown.dwarf_52ef::do_free_pages(Span *span,void *ptr)

{
  LogItem b;
  LogItem b_00;
  LogItem c;
  LogItem c_00;
  LogItem d;
  LogItem d_00;
  PageHeap *this;
  LogItem a;
  LogItem a_00;
  anon_class_8_1_8991a448 local_a0;
  LogItem local_98;
  LogItem local_88;
  LogItem local_78;
  LogItem local_68;
  LogItem local_58;
  LogItem local_48;
  LogItem local_38;
  LogItem local_28;
  void *local_18;
  void *ptr_local;
  Span *span_local;
  
  local_18 = ptr;
  ptr_local = span;
  if ((*(uint *)&span->field_0x28 >> 0x18 & 3) != 0) {
    tcmalloc::LogItem::LogItem(&local_28,"Object was not in-use");
    tcmalloc::LogItem::LogItem(&local_38);
    tcmalloc::LogItem::LogItem(&local_48);
    tcmalloc::LogItem::LogItem(&local_58);
    a._4_4_ = 0;
    a.tag_ = local_28.tag_;
    b.u_.str = local_38.u_.str;
    b.tag_ = local_38.tag_;
    b._4_4_ = local_38._4_4_;
    c.u_.str = local_48.u_.str;
    c.tag_ = local_48.tag_;
    c._4_4_ = local_48._4_4_;
    d.u_.str = local_58.u_.str;
    d.tag_ = local_58.tag_;
    d._4_4_ = local_58._4_4_;
    a.u_.str = local_28.u_.str;
    tcmalloc::Log(kCrash,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tcmalloc.cc"
                  ,0x5d4,a,b,c,d);
  }
  if ((void *)(*ptr_local << 0xd) != local_18) {
    tcmalloc::LogItem::LogItem(&local_68,"Pointer is not pointing to the start of a span");
    tcmalloc::LogItem::LogItem(&local_78);
    tcmalloc::LogItem::LogItem(&local_88);
    tcmalloc::LogItem::LogItem(&local_98);
    a_00._4_4_ = 0;
    a_00.tag_ = local_68.tag_;
    b_00.u_.str = local_78.u_.str;
    b_00.tag_ = local_78.tag_;
    b_00._4_4_ = local_78._4_4_;
    c_00.u_.str = local_88.u_.str;
    c_00.tag_ = local_88.tag_;
    c_00._4_4_ = local_88._4_4_;
    d_00.u_.str = local_98.u_.str;
    d_00.tag_ = local_98.tag_;
    d_00._4_4_ = local_98._4_4_;
    a_00.u_.str = local_68.u_.str;
    tcmalloc::Log(kCrash,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tcmalloc.cc"
                  ,0x5d7,a_00,b_00,c_00,d_00);
  }
  this = tcmalloc::Static::pageheap();
  local_a0.span = (Span **)&ptr_local;
  tcmalloc::PageHeap::
  PrepareAndDelete<(anonymous_namespace)::do_free_pages(tcmalloc::Span*,void*)::__0>
            (this,(Span *)ptr_local,&local_a0);
  return;
}

Assistant:

static ATTRIBUTE_NOINLINE void do_free_pages(Span* span, void* ptr) {
  // Check to see if the object is in use.
  CHECK_CONDITION_PRINT(span->location == Span::IN_USE,
                        "Object was not in-use");
  CHECK_CONDITION_PRINT(
      span->start << kPageShift == reinterpret_cast<uintptr_t>(ptr),
      "Pointer is not pointing to the start of a span");

  Static::pageheap()->PrepareAndDelete(span, [&] () {
    if (span->sample) {
      StackTrace* st = reinterpret_cast<StackTrace*>(span->objects);
      tcmalloc::DLL_Remove(span);
      Static::stacktrace_allocator()->Delete(st);
      span->objects = nullptr;
    }
  });
}